

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O0

void __thiscall deci::program_t::~program_t(program_t *this)

{
  bool bVar1;
  reference pcVar2;
  command_t command;
  iterator __end1;
  iterator __begin1;
  source_t *__range1;
  program_t *this_local;
  
  (this->super_function_t).super_value_t._vptr_value_t = (_func_int **)&PTR_DoHashing_00139a48;
  (*this->result->_vptr_value_t[3])();
  __end1 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::begin(&this->source);
  command.arg = (value_t *)
                std::vector<deci::command_t,_std::allocator<deci::command_t>_>::end(&this->source);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
                                *)&command.arg);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
             ::operator*(&__end1);
    command.opcode = *(opcode_t *)&pcVar2->arg;
    command._4_4_ = *(undefined4 *)((long)&pcVar2->arg + 4);
    (*pcVar2->arg->_vptr_value_t[3])();
    __gnu_cxx::
    __normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
    ::operator++(&__end1);
  }
  std::vector<deci::command_t,_std::allocator<deci::command_t>_>::~vector(&this->source);
  function_t::~function_t(&this->super_function_t);
  return;
}

Assistant:

program_t::~program_t() {
    result->Delete();
    for (auto command: this->source)
    {
      command.arg->Delete();
    }
  }